

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

bool __thiscall MT32Emu::Synth::playSysex(Synth *this,Bit8u *sysex,Bit32u len,Bit32u timestamp)

{
  bool bVar1;
  uint uVar2;
  Bit32u local_28;
  Bit32u timestamp_local;
  Bit32u len_local;
  Bit8u *sysex_local;
  Synth *this_local;
  
  if (this->midiQueue != (MidiEventQueue *)0x0) {
    local_28 = timestamp;
    if (this->midiDelayMode == MIDIDelayMode_DELAY_ALL) {
      local_28 = addMIDIInterfaceDelay(this,len,timestamp);
    }
    if ((this->activated & 1U) == 0) {
      this->activated = true;
    }
    do {
      bVar1 = MidiEventQueue::pushSysex(this->midiQueue,sysex,len,local_28);
      if (bVar1) {
        return true;
      }
      uVar2 = (*this->reportHandler->_vptr_ReportHandler[7])();
    } while ((uVar2 & 1) != 0);
  }
  return false;
}

Assistant:

bool Synth::playSysex(const Bit8u *sysex, Bit32u len, Bit32u timestamp) {
	if (midiQueue == NULL) return false;
	if (midiDelayMode == MIDIDelayMode_DELAY_ALL) {
		timestamp = addMIDIInterfaceDelay(len, timestamp);
	}
	if (!activated) activated = true;
	do {
		if (midiQueue->pushSysex(sysex, len, timestamp)) return true;
	} while (reportHandler->onMIDIQueueOverflow());
	return false;
}